

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerExclusiveLock(Pager *pPager)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = pPager->eLock;
  iVar2 = pagerLockDb(pPager,4);
  if (iVar2 != 0) {
    pagerUnlockDb(pPager,(uint)bVar1);
  }
  return iVar2;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */
  u8 eOrigLock;                   /* Original lock */

  assert( pPager->eLock>=SHARED_LOCK );
  eOrigLock = pPager->eLock;
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, eOrigLock);
  }

  return rc;
}